

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

ushort __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *interiorAddress)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  undefined4 *puVar5;
  
  pcVar1 = (this->super_HeapBlock).address;
  if (interiorAddress < pcVar1 || pcVar1 + 0x8000 <= interiorAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x246,
                       "(interiorAddress >= address && interiorAddress < this->GetEndAddress())",
                       "interiorAddress >= address && interiorAddress < this->GetEndAddress()");
    if (!bVar3) goto LAB_006b573f;
    *puVar5 = 0;
  }
  if (((ulong)(this->super_HeapBlock).address & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x247,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar3) goto LAB_006b573f;
    *puVar5 = 0;
  }
  uVar4 = ValidPointers<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
                    (&this->validPointers,
                     (uint)((int)interiorAddress - *(int *)&(this->super_HeapBlock).address) >> 4);
  if (0x800 < (ushort)(uVar4 + 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x24e,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar3) {
LAB_006b573f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return uVar4;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetInteriorAddressIndex(void * interiorAddress)
{
    Assert(interiorAddress >= address && interiorAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)interiorAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetInteriorAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}